

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O1

void __thiscall CharScanner::reportError(CharScanner *this,string *s)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  
  iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[0xc])();
  iVar1 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar1));
  if (iVar1 == 0) {
    poVar2 = (ostream *)&std::cerr;
    pcVar4 = "Error: ";
    lVar3 = 7;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in ",9);
    iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[0xc])(this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,*(char **)CONCAT44(extraout_var_00,iVar1),
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar1))[1]);
    pcVar4 = ": ";
    lVar3 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void CharScanner::reportError(const std::string& s)
{
	if (getFilename() == "")
		std::cerr << "Error: " << s << std::endl;
	else
		std::cerr << "Error in " << getFilename() << ": " << s << std::endl;
}